

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O0

bool __thiscall
sparse_square_matrix<bool>::get(sparse_square_matrix<bool> *this,uint32_t i,uint32_t j)

{
  bool bVar1;
  pointer pvVar2;
  byte local_41;
  _Node_iterator_base<std::pair<const_unsigned_long,_bool>,_false> local_38;
  ulong local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_bool>,_false> local_28;
  const_iterator iter;
  uint32_t j_local;
  uint32_t i_local;
  sparse_square_matrix<bool> *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_unsigned_long,_bool>,_false>._M_cur._0_4_ = j;
  iter.super__Node_iterator_base<std::pair<const_unsigned_long,_bool>,_false>._M_cur._4_4_ = i;
  if (this->N <= i) {
    __assert_fail("i < N",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/sparse_square_matrix.h"
                  ,0x39,
                  "const Ty sparse_square_matrix<bool>::get(uint32_t, uint32_t) const [Ty = bool]");
  }
  if (j < this->N) {
    bVar1 = usingDenseStorage(this);
    if (bVar1) {
      this_local._7_1_ =
           std::vector<bool,_std::allocator<bool>_>::operator[]
                     (&this->denseStorage,
                      (ulong)(iter.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_bool>,_false>
                              ._M_cur._4_4_ * this->N +
                             (uint32_t)
                             iter.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_bool>,_false>.
                             _M_cur));
    }
    else {
      local_30 = (ulong)(iter.super__Node_iterator_base<std::pair<const_unsigned_long,_bool>,_false>
                         ._M_cur._4_4_ * this->N +
                        (uint32_t)
                        iter.super__Node_iterator_base<std::pair<const_unsigned_long,_bool>,_false>.
                        _M_cur);
      local_28._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_bool,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bool>_>_>
           ::find(&this->sparseStorage,&local_30);
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_bool,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bool>_>_>
           ::end(&this->sparseStorage);
      bVar1 = std::__detail::operator==(&local_28,&local_38);
      if (bVar1) {
        local_41 = 0;
      }
      else {
        pvVar2 = std::__detail::
                 _Node_const_iterator<std::pair<const_unsigned_long,_bool>,_false,_false>::
                 operator->((_Node_const_iterator<std::pair<const_unsigned_long,_bool>,_false,_false>
                             *)&local_28);
        local_41 = pvVar2->second;
      }
      this_local._7_1_ = (const_reference)(local_41 & 1);
    }
    return this_local._7_1_;
  }
  __assert_fail("j < N",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/sparse_square_matrix.h"
                ,0x3a,
                "const Ty sparse_square_matrix<bool>::get(uint32_t, uint32_t) const [Ty = bool]");
}

Assistant:

const Ty get(uint32_t i, uint32_t j) const {
    assert(i < N);
    assert(j < N);
    if (usingDenseStorage()) {
      return denseStorage[i * N + j];
    }
    auto iter = sparseStorage.find(i * N + j);
    return iter == sparseStorage.end() ? Ty() : iter->second;
  }